

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O0

void __thiscall
HighsHashTree<std::pair<int,_int>,_double>::InnerLeaf<3>::InnerLeaf<2>
          (InnerLeaf<3> *this,InnerLeaf<2> *other)

{
  const_iterator __n;
  HighsHashTableEntry<std::pair<int,_int>,_double> *__x;
  iterator __first;
  pair<int,_int> *in_RSI;
  HighsHashTableEntry<std::pair<int,_int>,_double> *in_RDI;
  unsigned_long *in_stack_ffffffffffffffd0;
  array<HighsHashTableEntry<std::pair<int,_int>,_double>,_38UL> *in_stack_ffffffffffffffe0;
  
  Occupation::Occupation((Occupation *)in_RDI);
  std::array<HighsHashTableEntry<std::pair<int,_int>,_double>,_38UL>::array
            (in_stack_ffffffffffffffe0);
  in_RDI->key_ = *in_RSI;
  *(int *)&in_RDI->value_ = in_RSI[1].first;
  __n = std::array<unsigned_long,_23UL>::cbegin((array<unsigned_long,_23UL> *)0x73c517);
  std::array<unsigned_long,_23UL>::cbegin((array<unsigned_long,_23UL> *)0x73c529);
  __x = (HighsHashTableEntry<std::pair<int,_int>,_double> *)
        std::next<unsigned_long_const*>(in_stack_ffffffffffffffd0,(difference_type)__n);
  std::array<unsigned_long,_39UL>::begin((array<unsigned_long,_39UL> *)0x73c552);
  std::copy<unsigned_long_const*,unsigned_long*>
            ((unsigned_long *)in_stack_ffffffffffffffe0,(unsigned_long *)in_RDI,(unsigned_long *)__x
            );
  __first = std::array<HighsHashTableEntry<std::pair<int,_int>,_double>,_22UL>::begin
                      ((array<HighsHashTableEntry<std::pair<int,_int>,_double>,_22UL> *)0x73c574);
  std::array<HighsHashTableEntry<std::pair<int,_int>,_double>,_22UL>::begin
            ((array<HighsHashTableEntry<std::pair<int,_int>,_double>,_22UL> *)0x73c58a);
  std::next<HighsHashTableEntry<std::pair<int,int>,double>*>(__x,(difference_type)__n);
  std::array<HighsHashTableEntry<std::pair<int,_int>,_double>,_38UL>::begin
            ((array<HighsHashTableEntry<std::pair<int,_int>,_double>,_38UL> *)0x73c5b1);
  std::
  move<HighsHashTableEntry<std::pair<int,int>,double>*,HighsHashTableEntry<std::pair<int,int>,double>*>
            (__first,in_RDI,__x);
  return;
}

Assistant:

InnerLeaf(InnerLeaf<kOtherSize>&& other) {
      assert(other.size <= capacity());
      occupation = other.occupation;
      size = other.size;
      std::copy(other.hashes.cbegin(),
                std::next(other.hashes.cbegin(), size + 1), hashes.begin());
      std::move(other.entries.begin(), std::next(other.entries.begin(), size),
                entries.begin());
    }